

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpCrashHandler.c
# Opt level: O2

void assertFailureCallback(char *expr,char *file,int line)

{
  qpCrashHandler *pqVar1;
  
  pqVar1 = g_crashHandler;
  (g_crashHandler->crashInfo).type = QP_CRASHTYPE_ASSERT;
  (pqVar1->crashInfo).message = expr;
  (pqVar1->crashInfo).file = file;
  (pqVar1->crashInfo).line = line;
  if (pqVar1->crashHandlerFunc != (qpCrashHandlerFunc)0x0) {
    (*pqVar1->crashHandlerFunc)(pqVar1,pqVar1->handlerUserPointer);
    return;
  }
  return;
}

Assistant:

static void assertFailureCallback (const char* expr, const char* file, int line)
{
	/* Store info. */
	qpCrashInfo_set(&g_crashHandler->crashInfo, QP_CRASHTYPE_ASSERT, expr, file, line);

	/* Handle the crash. */
	if (g_crashHandler->crashHandlerFunc != DE_NULL)
		g_crashHandler->crashHandlerFunc(g_crashHandler, g_crashHandler->handlerUserPointer);
}